

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lls.c
# Opt level: O0

int lls_qr(double *Ai,double *bi,int M,int N,double *xo)

{
  undefined4 local_2c;
  int ret;
  double *xo_local;
  int N_local;
  int M_local;
  double *bi_local;
  double *Ai_local;
  
  if (M < N) {
    local_2c = lls_qr_undetermined(Ai,bi,M,N,xo);
  }
  else {
    local_2c = lls_qr_determined(Ai,bi,M,N,xo);
  }
  return local_2c;
}

Assistant:

int lls_qr(double *Ai,double *bi,int M,int N,double *xo) {
	int ret;

	if (M >= N) {
		ret = lls_qr_determined(Ai,bi,M,N,xo);
	} else {
		ret = lls_qr_undetermined(Ai,bi,M,N,xo);
	}

	return ret;
}